

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

bool __thiscall FBehavior::Init(FBehavior *this,int lumpnum,FileReader *fr,int len)

{
  char *to;
  SDWORD *pSVar1;
  BYTE *pBVar2;
  byte bVar3;
  char cVar4;
  ScriptFunction *pSVar5;
  uint *puVar6;
  ACSFormat AVar7;
  DWORD DVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  DWORD *list_2;
  BYTE *pBVar12;
  ACSProfileInfo *pAVar13;
  ulong *puVar14;
  long lVar15;
  ArrayInfo *pAVar16;
  SDWORD *pSVar17;
  ArrayInfo **ppAVar18;
  uint *puVar19;
  FBehavior *pFVar20;
  ScriptFunction *pSVar21;
  int iVar22;
  ACSProfileInfo *pAVar23;
  uint uVar24;
  ulong uVar25;
  int *piVar26;
  int *piVar27;
  char *name;
  uint *puVar28;
  uint uVar29;
  BYTE *chunk;
  int *piVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int *local_78;
  int *local_70;
  int *local_68;
  
  this->LumpNum = lumpnum;
  if (fr == (FileReader *)0x0) {
    len = FWadCollection::LumpLength(&Wads,lumpnum);
    if (len < 0x20) {
      return false;
    }
    uVar31 = (ulong)(uint)len;
    pBVar12 = (BYTE *)operator_new__(uVar31);
    FWadCollection::ReadLump(&Wads,lumpnum,pBVar12);
  }
  else {
    if (len < 0x20) {
      return false;
    }
    uVar31 = (ulong)(uint)len;
    pBVar12 = (BYTE *)operator_new__(uVar31);
    (*(fr->super_FileReaderBase)._vptr_FileReaderBase[2])(fr,pBVar12,uVar31);
  }
  if (((*pBVar12 != 'A') || (pBVar12[1] != 'C')) || (pBVar12[2] != 'S')) {
LAB_00501128:
    operator_delete__(pBVar12);
    return false;
  }
  bVar3 = pBVar12[3];
  AVar7 = (ACSFormat)bVar3;
  if (bVar3 != 0) {
    if (bVar3 == 0x65) {
      AVar7 = ACS_LittleEnhanced;
    }
    else {
      if (bVar3 != 0x45) goto LAB_00501128;
      AVar7 = ACS_Enhanced;
    }
  }
  this->Format = AVar7;
  TArray<FBehavior_*,_FBehavior_*>::Grow(&StaticModules,1);
  StaticModules.Array[StaticModules.Count] = this;
  DVar8 = StaticModules.Count << 0x14;
  to = this->ModuleName;
  StaticModules.Count = StaticModules.Count + 1;
  this->LibraryID = DVar8;
  if (fr == (FileReader *)0x0) {
    FWadCollection::GetLumpName(&Wads,to,lumpnum);
    this->ModuleName[8] = '\0';
  }
  else {
    builtin_strncpy(to,"BEHAVIOR",9);
  }
  this->Data = pBVar12;
  this->DataSize = len;
  uVar10 = *(uint *)(pBVar12 + 4);
  pBVar2 = pBVar12 + uVar10;
  if (this->Format == ACS_Old) {
    uVar29 = *(uint *)(pBVar2 + -4);
    this->Chunks = pBVar12 + uVar31;
    if ((0x17 < uVar10) && ((uVar29 | 0x20000000) == 0x65534341)) {
      this->Format = (uVar29 == 0x65534341) + ACS_Enhanced;
      this->Chunks = pBVar12 + *(uint *)(pBVar2 + -8);
      this->DataSize = uVar10 - 8;
    }
  }
  else {
    this->Chunks = pBVar2;
  }
  pFVar20 = this;
  LoadScriptsDirectory(this);
  if (this->Format == ACS_Old) {
    pBVar12 = this->Data;
    uVar10 = *(uint *)(pBVar12 + 4);
    this->StringTable = uVar10;
    uVar10 = uVar10 + *(int *)(pBVar12 + uVar10) * 0xc + 4;
    this->StringTable = uVar10;
    UnescapeStringTable(pFVar20,pBVar12 + uVar10,pBVar12,false);
  }
  else {
    UnencryptStrings(this);
    piVar30 = (int *)this->Chunks;
    if (piVar30 != (int *)0x0) {
      for (; piVar30 < this->Data + this->DataSize;
          piVar30 = (int *)((long)piVar30 + (ulong)(piVar30[1] + 8))) {
        if (*piVar30 == 0x4c525453) {
          this->StringTable = ((int)piVar30 - (int)this->Data) + 8;
          if (piVar30[3] != 0) {
            uVar31 = 0;
            do {
              strbin((char *)((long)piVar30 + (long)piVar30[(ulong)((int)uVar31 + 3) + 2] + 8));
              uVar31 = uVar31 + 1;
            } while (uVar31 < (uint)piVar30[3]);
          }
          goto LAB_005012bd;
        }
      }
    }
    this->StringTable = 0;
  }
LAB_005012bd:
  if (this->Format == ACS_Old) {
    pSVar1 = this->MapVarStore;
    lVar33 = 0;
    lVar34 = 1;
    lVar15 = 0;
    auVar35._8_4_ = (int)pSVar1;
    auVar35._0_8_ = pSVar1;
    auVar35._12_4_ = (int)((ulong)pSVar1 >> 0x20);
    do {
      this->MapVars[lVar15] = pSVar1 + lVar33;
      (this->MapVars + lVar15)[1] = (SDWORD *)(lVar34 * 4 + auVar35._8_8_);
      lVar15 = lVar15 + 2;
      lVar33 = lVar33 + 2;
      lVar34 = lVar34 + 2;
    } while (lVar15 != 0x80);
    goto LAB_0050216c;
  }
  this->Functions = (ScriptFunction *)0x0;
  piVar30 = (int *)this->Chunks;
  if (piVar30 == (int *)0x0) {
LAB_005015c5:
    memset(this->MapVarStore,0,0x200);
  }
  else {
    piVar26 = (int *)(this->Data + this->DataSize);
    piVar27 = piVar30;
    if (piVar30 < piVar26) {
LAB_00501363:
      uVar10 = piVar27[1];
      if (*piVar27 != 0x434e5546) goto code_r0x00501370;
      uVar29 = uVar10 >> 3;
      uVar31 = (ulong)uVar29;
      this->NumFunctions = uVar29;
      pAVar13 = (ACSProfileInfo *)operator_new__((ulong)(uVar10 & 0xfffffff8) * 3);
      if (7 < uVar10) {
        pAVar23 = pAVar13;
        do {
          pAVar23->TotalInstr = 0;
          pAVar23->NumRuns = 0;
          pAVar23->MinInstrPerRun = 0xffffffff;
          pAVar23->MaxInstrPerRun = 0;
          pAVar23 = pAVar23 + 1;
        } while (pAVar23 != pAVar13 + uVar31);
      }
      this->FunctionProfileData = pAVar13;
      puVar14 = (ulong *)operator_new__(uVar31 * 0x20 + 8);
      pSVar5 = (ScriptFunction *)(puVar14 + 1);
      *puVar14 = uVar31;
      if (uVar10 < 8) {
        this->Functions = pSVar5;
      }
      else {
        lVar15 = 0;
        do {
          *(undefined4 *)((long)puVar14 + lVar15 + 0x18) = 0;
          *(undefined8 *)((long)puVar14 + lVar15 + 0x20) = 0;
          lVar15 = lVar15 + 0x20;
        } while (uVar31 * 0x20 != lVar15);
        this->Functions = pSVar5;
        if (7 < uVar10) {
          uVar31 = 0;
          do {
            (&pSVar5->ArgCount)[uVar31 * 4] = *(BYTE *)((long)piVar27 + uVar31 + 8);
            *(undefined1 *)((long)puVar14 + uVar31 * 4 + 9) =
                 *(undefined1 *)((long)piVar27 + uVar31 + 10);
            *(undefined1 *)((long)puVar14 + uVar31 * 4 + 10) =
                 *(undefined1 *)((long)piVar27 + uVar31 + 0xb);
            *(uint *)((long)puVar14 + uVar31 * 4 + 0xc) =
                 (uint)*(byte *)((long)piVar27 + uVar31 + 9);
            *(undefined4 *)((long)puVar14 + uVar31 * 4 + 0x10) =
                 *(undefined4 *)((long)piVar27 + uVar31 + 0xc);
            uVar31 = uVar31 + 8;
          } while (uVar29 * 8 != uVar31);
        }
      }
LAB_005014bb:
      piVar27 = piVar30;
      if (0 < this->NumFunctions) {
        for (; piVar27 < piVar26; piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8))) {
          if (*piVar27 == 0x59524146) goto LAB_00501517;
        }
      }
      goto LAB_00501583;
    }
LAB_00501588:
    piVar27 = piVar30;
    if (this->Data + this->DataSize <= piVar30) {
      memset(this->MapVarStore,0,0x200);
LAB_005018fb:
LAB_00501909:
      if (piVar30 < this->Data + this->DataSize) {
        if (*piVar30 != 0x494e494d) goto code_r0x0050191b;
        pBVar12 = this->Data;
        while( true ) {
          uVar10 = piVar30[1];
          if (7 < uVar10) {
            iVar9 = piVar30[2];
            uVar31 = 0;
            do {
              this->MapVarStore[(long)iVar9 + uVar31] = piVar30[uVar31 + 3];
              uVar31 = uVar31 + 1;
            } while ((uVar10 >> 2) - 1 != uVar31);
            uVar10 = piVar30[1];
          }
          piVar27 = (int *)((ulong)(uVar10 + 8) + (long)piVar30);
          if (pBVar12 + this->DataSize <= piVar27) break;
          iVar9 = *piVar30;
          while (piVar30 = piVar27, *piVar27 != iVar9) {
            piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
            if (pBVar12 + this->DataSize <= piVar27) goto LAB_005015d8;
          }
        }
      }
      goto LAB_005015d8;
    }
    do {
      if (*piVar27 == 0x504d554a) {
        if (0 < piVar27[1]) {
          lVar15 = 0;
          do {
            iVar9 = *(int *)((long)piVar27 + lVar15 + 8);
            TArray<int,_int>::Grow(&this->JumpPoints,1);
            (this->JumpPoints).Array[(this->JumpPoints).Count] = iVar9;
            puVar28 = &(this->JumpPoints).Count;
            *puVar28 = *puVar28 + 1;
            lVar15 = lVar15 + 4;
          } while ((int)lVar15 < piVar27[1]);
          piVar30 = (int *)this->Chunks;
        }
        break;
      }
      piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
    } while (piVar27 < this->Data + this->DataSize);
    memset(this->MapVarStore,0,0x200);
    if (piVar30 != (int *)0x0) goto LAB_005018fb;
  }
LAB_005015d8:
  local_70 = &this->NumFunctions;
  pSVar1 = this->MapVarStore;
  lVar33 = 0;
  lVar34 = 1;
  lVar15 = 0;
  auVar36._8_4_ = (int)pSVar1;
  auVar36._0_8_ = pSVar1;
  auVar36._12_4_ = (int)((ulong)pSVar1 >> 0x20);
  do {
    this->MapVars[lVar15] = pSVar1 + lVar33;
    (this->MapVars + lVar15)[1] = (SDWORD *)(lVar34 * 4 + auVar36._8_8_);
    lVar15 = lVar15 + 2;
    lVar33 = lVar33 + 2;
    lVar34 = lVar34 + 2;
  } while (lVar15 != 0x80);
  piVar30 = (int *)this->Chunks;
  if (piVar30 == (int *)0x0) {
    uVar31 = (ulong)(uint)this->NumArrays;
    this->NumTotalArrays = this->NumArrays;
LAB_005017db:
    uVar10 = (uint)uVar31;
  }
  else {
    piVar26 = (int *)(this->Data + this->DataSize);
    piVar27 = piVar30;
    if (piVar26 <= piVar30) {
      uVar31 = (ulong)(uint)this->NumArrays;
      this->NumTotalArrays = this->NumArrays;
LAB_005017ab:
      local_68 = &this->NumTotalArrays;
      for (piVar27 = piVar30; piVar27 < this->Data + this->DataSize;
          piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8))) {
        if (*piVar27 == 0x504d4941) {
          uVar10 = piVar27[2] + (int)uVar31;
          *local_68 = uVar10;
          goto LAB_005017de;
        }
      }
      goto LAB_005017db;
    }
    do {
      uVar10 = piVar27[1];
      if (*piVar27 == 0x59415241) {
        uVar29 = uVar10 >> 3;
        this->NumArrays = uVar29;
        pAVar16 = (ArrayInfo *)operator_new__((ulong)uVar29 << 4);
        this->ArrayStore = pAVar16;
        memset(pAVar16,0,(ulong)(uVar10 & 0xfffffff8));
        if (7 < uVar10) {
          pAVar16 = this->ArrayStore;
          uVar31 = 0;
          do {
            pSVar1[(uint)piVar27[uVar31 * 2 + 2]] = (SDWORD)uVar31;
            uVar10 = piVar27[uVar31 * 2 + 3];
            pAVar16->ArraySize = uVar10;
            pSVar17 = (SDWORD *)operator_new__((ulong)uVar10 << 2);
            pAVar16->Elements = pSVar17;
            memset(pSVar17,0,(ulong)pAVar16->ArraySize << 2);
            uVar31 = uVar31 + 1;
            pAVar16 = pAVar16 + 1;
          } while (uVar31 < uVar29);
        }
        break;
      }
      piVar27 = (int *)((long)piVar27 + (ulong)(uVar10 + 8));
    } while (piVar27 < piVar26);
    piVar27 = piVar30;
    if (piVar30 < piVar26) {
LAB_00501763:
      if (*piVar27 != 0x494e4941) goto code_r0x0050176f;
      pBVar12 = this->Data;
      pAVar16 = this->ArrayStore;
      while( true ) {
        uVar10 = this->MapVarStore[(uint)piVar27[2]];
        if (uVar10 < (uint)this->NumArrays) {
          uVar29 = pAVar16[(int)uVar10].ArraySize;
          uVar24 = piVar27[1] - 4U >> 2;
          if (uVar29 < uVar24) {
            uVar24 = uVar29;
          }
          if (uVar24 != 0) {
            pSVar17 = pAVar16[(int)uVar10].Elements;
            uVar31 = 0;
            do {
              pSVar17[uVar31] = piVar27[uVar31 + 3];
              uVar31 = uVar31 + 1;
            } while (uVar24 != uVar31);
          }
        }
        piVar26 = (int *)((ulong)(piVar27[1] + 8) + (long)piVar27);
        if (pBVar12 + this->DataSize <= piVar26) break;
        iVar9 = *piVar27;
        piVar27 = piVar26;
        while (*piVar27 != iVar9) {
          piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
          if (pBVar12 + this->DataSize <= piVar27) goto LAB_0050177d;
        }
      }
    }
LAB_0050177d:
    uVar10 = this->NumArrays;
    uVar31 = (ulong)uVar10;
    this->NumTotalArrays = uVar10;
    if (piVar30 != (int *)0x0) goto LAB_005017ab;
  }
LAB_005017de:
  local_68 = &this->NumTotalArrays;
  local_78 = &this->NumArrays;
  if (uVar10 != 0) {
    uVar25 = 0xffffffffffffffff;
    if (-1 < (int)uVar10) {
      uVar25 = (long)(int)uVar10 << 3;
    }
    ppAVar18 = (ArrayInfo **)operator_new__(uVar25);
    this->Arrays = ppAVar18;
    if (0 < (int)uVar31) {
      lVar15 = 0;
      lVar33 = 0;
      do {
        *(long *)((long)this->Arrays + lVar33 * 2) = (long)&this->ArrayStore->ArraySize + lVar15;
        lVar33 = lVar33 + 4;
        lVar15 = lVar15 + 0x10;
      } while (uVar31 << 4 != lVar15);
      piVar30 = (int *)this->Chunks;
    }
  }
  if (this->LibraryID == 0) goto LAB_00501d2c;
  if (piVar30 == (int *)0x0) goto LAB_0050216c;
  piVar27 = piVar30;
  if (piVar30 < this->Data + this->DataSize) {
    do {
      if (*piVar27 == 0x5254534d) {
        uVar10 = piVar27[1];
        if (3 < uVar10) {
          uVar31 = 0;
          do {
            if ((ulong)this->StringTable != 0) {
              puVar28 = (uint *)((ulong)this->StringTable + (long)this->Data);
              if (this->Format == ACS_Old) {
                iVar9 = 1;
                uVar29 = *puVar28;
                puVar19 = (uint *)this->Data;
              }
              else {
                iVar9 = 3;
                uVar29 = puVar28[1];
                puVar19 = puVar28;
              }
              if ((uint)this->MapVarStore[(uint)piVar27[uVar31 + 2]] < uVar29) {
                iVar9 = ACSStringPool::AddString
                                  (&GlobalACSStrings,
                                   (char *)((ulong)puVar28[(uint)(iVar9 + this->MapVarStore
                                                                          [(uint)piVar27[uVar31 + 2]
                                                                          ])] + (long)puVar19));
                pSVar1[(uint)piVar27[uVar31 + 2]] = iVar9;
                uVar10 = piVar27[1];
              }
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 < uVar10 >> 2);
          piVar30 = (int *)this->Chunks;
        }
        break;
      }
      piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
    } while (piVar27 < this->Data + this->DataSize);
    if (piVar30 == (int *)0x0) goto LAB_0050216c;
  }
  piVar27 = piVar30;
  if (piVar30 < this->Data + this->DataSize) {
    do {
      if (*piVar27 == 0x52545341) {
        uVar10 = piVar27[1];
        if (3 < uVar10) {
          uVar31 = 0;
          do {
            uVar29 = pSVar1[(uint)piVar27[uVar31 + 2]];
            if (uVar29 < (uint)*local_78) {
              DVar8 = this->ArrayStore[(int)uVar29].ArraySize;
              if (0 < (int)DVar8) {
                puVar28 = (uint *)this->ArrayStore[(int)uVar29].Elements;
                iVar9 = DVar8 + 1;
                do {
                  if ((ulong)this->StringTable != 0) {
                    puVar19 = (uint *)((ulong)this->StringTable + (long)this->Data);
                    if (this->Format == ACS_Old) {
                      iVar22 = 1;
                      uVar10 = *puVar19;
                      puVar6 = (uint *)this->Data;
                    }
                    else {
                      iVar22 = 3;
                      uVar10 = puVar19[1];
                      puVar6 = puVar19;
                    }
                    if (*puVar28 < uVar10) {
                      uVar10 = ACSStringPool::AddString
                                         (&GlobalACSStrings,
                                          (char *)((ulong)puVar19[iVar22 + *puVar28] + (long)puVar6)
                                         );
                      *puVar28 = uVar10;
                    }
                  }
                  puVar28 = puVar28 + 1;
                  iVar9 = iVar9 + -1;
                } while (1 < iVar9);
                uVar10 = piVar27[1];
              }
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 < uVar10 >> 2);
          piVar30 = (int *)this->Chunks;
        }
        break;
      }
      piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
    } while (piVar27 < this->Data + this->DataSize);
    if (piVar30 == (int *)0x0) goto LAB_0050216c;
  }
  piVar27 = piVar30;
  if (piVar30 < this->Data + this->DataSize) {
    do {
      if (*piVar27 == 0x47415441) goto LAB_00501c1f;
      piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
    } while (piVar27 < this->Data + this->DataSize);
    goto LAB_00501d2c;
  }
LAB_00501d35:
  for (; piVar30 < this->Data + this->DataSize;
      piVar30 = (int *)((long)piVar30 + (ulong)(piVar30[1] + 8))) {
    if (*piVar30 == 0x44414f4c) {
      uVar10 = piVar30[1];
      if (uVar10 != 0) {
        uVar31 = 0;
        do {
          uVar29 = (uint)uVar31;
          if (*(char *)((long)piVar30 + uVar31 + 8) != '\0') {
            name = (char *)((long)piVar30 + uVar31 + 8);
            iVar9 = FWadCollection::CheckNumForName(&Wads,name,4);
            if (iVar9 < 0) {
              Printf("\x1cGCould not find ACS library %s.\n",name);
            }
            else {
              pFVar20 = StaticLoadModule(iVar9,(FileReader *)0x0,0);
              if (pFVar20 != (FBehavior *)0x0) {
                TArray<FBehavior_*,_FBehavior_*>::Grow(&this->Imports,1);
                uVar10 = (this->Imports).Count;
                (this->Imports).Array[uVar10] = pFVar20;
                (this->Imports).Count = uVar10 + 1;
              }
            }
            do {
              uVar29 = (int)uVar31 + 1;
              uVar31 = (ulong)uVar29;
            } while (*(char *)((long)piVar30 + uVar31 + 8) != '\0');
            uVar10 = piVar30[1];
          }
          uVar31 = (ulong)(uVar29 + 1);
        } while (uVar29 + 1 < uVar10);
      }
      if ((this->Imports).Count != 0) {
        uVar31 = 0;
        do {
          pFVar20 = (this->Imports).Array[uVar31];
          if (pFVar20 != (FBehavior *)0x0) {
            piVar30 = (int *)this->Chunks;
            if (piVar30 != (int *)0x0) {
              for (piVar27 = piVar30; piVar27 < this->Data + this->DataSize;
                  piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8))) {
                if (*piVar27 == 0x4d414e46) goto LAB_00501e77;
              }
            }
            piVar27 = (int *)0x0;
LAB_00501e77:
            iVar9 = *local_70;
            if (0 < iVar9) {
              lVar33 = 8;
              lVar15 = 0;
              do {
                pSVar5 = this->Functions;
                if (((*(int *)(&pSVar5->ArgCount + lVar33) == 0) &&
                    (*(char *)((long)pSVar5 + lVar33 + -6) == '\0')) &&
                   (uVar10 = FindFunctionName(pFVar20,(char *)((long)piVar27 +
                                                              (ulong)(uint)piVar27[lVar15 + 3] + 8))
                   , -1 < (int)uVar10)) {
                  if ((pFVar20->Functions[uVar10].Address != 0) &&
                     (pSVar21 = pFVar20->Functions + uVar10, pSVar21->ImportNum == '\0')) {
                    *(uint *)(&pSVar5->ArgCount + lVar33) = uVar10;
                    *(char *)((long)pSVar5 + lVar33 + -6) = (char)uVar31 + '\x01';
                    if (pSVar21->ArgCount != *(byte *)((long)pSVar5 + lVar33 + -8)) {
                      Printf("\x1cIFunction %s in %s has %d arguments. %s expects it to have %d.\n",
                             (long)piVar27 + (ulong)(uint)piVar27[lVar15 + 3] + 8,
                             pFVar20->ModuleName,(ulong)pSVar21->ArgCount,to);
                      this->Format = ACS_Unknown;
                      iVar9 = this->NumFunctions;
                    }
                    *(int *)((long)pSVar5 + lVar33 + -4) = pSVar21->LocalCount;
                    *(BYTE *)((long)pSVar5 + lVar33 + -7) = pSVar21->HasReturnValue;
                  }
                }
                lVar15 = lVar15 + 1;
                lVar33 = lVar33 + 0x20;
              } while (lVar15 < iVar9);
              piVar30 = (int *)this->Chunks;
            }
            if (piVar30 != (int *)0x0) {
              for (; piVar30 < this->Data + this->DataSize;
                  piVar30 = (int *)((long)piVar30 + (ulong)(piVar30[1] + 8))) {
                if (*piVar30 == 0x504d494d) {
                  uVar10 = piVar30[1];
                  if (uVar10 != 0) {
                    uVar25 = 0;
                    do {
                      uVar29 = FindMapVarName(pFVar20,(char *)((long)piVar30 +
                                                              (ulong)((int)uVar25 + 4) + 8));
                      if (-1 < (int)uVar29) {
                        this->MapVars[*(uint *)((long)piVar30 + uVar25 + 8)] =
                             pFVar20->MapVarStore + uVar29;
                      }
                      uVar32 = (ulong)((int)uVar25 + 5);
                      do {
                        uVar29 = (int)uVar32 + 1;
                        uVar25 = (ulong)uVar29;
                        lVar15 = uVar32 + 8;
                        uVar32 = uVar25;
                      } while (*(char *)((long)piVar30 + lVar15) != '\0');
                    } while (uVar29 < uVar10);
                  }
                  break;
                }
              }
            }
            if (*local_78 < *local_68) {
              piVar30 = (int *)this->Chunks;
              if (piVar30 != (int *)0x0) {
                for (; piVar30 < this->Data + this->DataSize;
                    piVar30 = (int *)((long)piVar30 + (ulong)(piVar30[1] + 8))) {
                  if (*piVar30 == 0x504d4941) goto LAB_0050207d;
                }
              }
              piVar30 = (int *)0x0;
LAB_0050207d:
              if (piVar30[2] != 0) {
                puVar28 = (uint *)(piVar30 + 3);
                uVar10 = 0;
                do {
                  uVar29 = *puVar28;
                  uVar24 = puVar28[1];
                  uVar11 = FindMapVarName(pFVar20,(char *)(puVar28 + 2));
                  if ((-1 < (int)uVar11) &&
                     (lVar15 = (long)pFVar20->MapVarStore[uVar11], -1 < lVar15)) {
                    uVar11 = this->NumArrays + uVar10;
                    this->Arrays[uVar11] = pFVar20->ArrayStore + lVar15;
                    this->MapVarStore[uVar29] = uVar11;
                    uVar29 = pFVar20->ArrayStore[lVar15].ArraySize;
                    if (uVar29 != uVar24) {
                      this->Format = ACS_Unknown;
                      Printf("\x1cIThe array %s in %s has %u elements, but %s expects it to only have %u.\n"
                             ,puVar28 + 2,pFVar20->ModuleName,(ulong)uVar29,to,(ulong)uVar24);
                    }
                  }
                  puVar28 = (uint *)((long)puVar28 + 9);
                  do {
                    uVar29 = *puVar28;
                    puVar28 = (uint *)((long)puVar28 + 1);
                  } while ((char)uVar29 != '\0');
                  uVar10 = uVar10 + 1;
                } while (uVar10 < (uint)piVar30[2]);
              }
            }
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 < (this->Imports).Count);
      }
      break;
    }
  }
LAB_0050216c:
  DPrintf(3,"Loaded %d scripts, %d functions\n",(ulong)(uint)this->NumScripts,
          (ulong)(uint)this->NumFunctions);
  return true;
code_r0x00501370:
  piVar27 = (int *)((long)piVar27 + (ulong)(uVar10 + 8));
  if (piVar26 <= piVar27) goto LAB_005014bb;
  goto LAB_00501363;
LAB_00501517:
  while( true ) {
    iVar9 = piVar27[1];
    if ((5 < iVar9) && ((uint)*(ushort *)(piVar27 + 2) < (uint)this->NumFunctions)) {
      pSVar5 = this->Functions + *(ushort *)(piVar27 + 2);
      iVar9 = ParseLocalArrayChunk
                        (piVar27,&pSVar5->LocalArrays,(uint)pSVar5->ArgCount + pSVar5->LocalCount);
      pSVar5->LocalCount = iVar9 - (uint)pSVar5->ArgCount;
      iVar9 = piVar27[1];
    }
    piVar30 = (int *)((ulong)(iVar9 + 8) + (long)piVar27);
    if (this->Data + this->DataSize <= piVar30) break;
    iVar9 = *piVar27;
    while (piVar27 = piVar30, *piVar30 != iVar9) {
      piVar30 = (int *)((long)piVar30 + (ulong)(piVar30[1] + 8));
      if (this->Data + this->DataSize <= piVar30) goto LAB_0050157c;
    }
  }
LAB_0050157c:
  piVar30 = (int *)this->Chunks;
LAB_00501583:
  if (piVar30 == (int *)0x0) goto LAB_005015c5;
  goto LAB_00501588;
code_r0x0050191b:
  piVar30 = (int *)((long)piVar30 + (ulong)(piVar30[1] + 8));
  goto LAB_00501909;
code_r0x0050176f:
  piVar27 = (int *)((long)piVar27 + (ulong)(piVar27[1] + 8));
  if (piVar26 <= piVar27) goto LAB_0050177d;
  goto LAB_00501763;
LAB_00501c1f:
  if (((char)piVar27[2] == '\0') &&
     (uVar10 = pSVar1[*(int *)((long)piVar27 + 9)], uVar10 < (uint)*local_78)) {
    uVar29 = this->ArrayStore[(int)uVar10].ArraySize;
    uVar24 = piVar27[1] - 5U;
    if (uVar29 <= piVar27[1] - 5U) {
      uVar24 = uVar29;
    }
    if (0 < (int)uVar24) {
      pSVar17 = this->ArrayStore[(int)uVar10].Elements;
      iVar9 = uVar24 + 1;
      lVar15 = 0;
      do {
        cVar4 = *(char *)((long)piVar27 + lVar15 + 0xd);
        if (cVar4 == '\x01') {
          if ((ulong)this->StringTable != 0) {
            puVar28 = (uint *)((ulong)this->StringTable + (long)this->Data);
            if (this->Format == ACS_Old) {
              iVar22 = 1;
              uVar10 = *puVar28;
              puVar19 = (uint *)this->Data;
            }
            else {
              iVar22 = 3;
              uVar10 = puVar28[1];
              puVar19 = puVar28;
            }
            if ((uint)pSVar17[lVar15] < uVar10) {
              uVar10 = ACSStringPool::AddString
                                 (&GlobalACSStrings,
                                  (char *)((ulong)puVar28[(uint)(iVar22 + pSVar17[lVar15])] +
                                          (long)puVar19));
              goto LAB_00501cda;
            }
          }
        }
        else if (cVar4 == '\x02') {
          uVar10 = pSVar17[lVar15] | this->LibraryID;
LAB_00501cda:
          pSVar17[lVar15] = uVar10;
        }
        iVar9 = iVar9 + -1;
        lVar15 = lVar15 + 1;
      } while (1 < iVar9);
    }
  }
  piVar30 = (int *)((ulong)(piVar27[1] + 8) + (long)piVar27);
  if (this->Data + this->DataSize <= piVar30) goto LAB_00501d25;
  iVar9 = *piVar27;
  while (piVar27 = piVar30, *piVar30 != iVar9) {
    piVar30 = (int *)((long)piVar30 + (ulong)(piVar30[1] + 8));
    if (this->Data + this->DataSize <= piVar30) goto LAB_00501d25;
  }
  goto LAB_00501c1f;
LAB_00501d25:
  piVar30 = (int *)this->Chunks;
LAB_00501d2c:
  if (piVar30 == (int *)0x0) goto LAB_0050216c;
  goto LAB_00501d35;
}

Assistant:

bool FBehavior::Init(int lumpnum, FileReader * fr, int len)
{
	BYTE *object;
	int i;

	LumpNum = lumpnum;

	// Now that everything is set up, record this module as being among the loaded modules.
	// We need to do this before resolving any imports, because an import might (indirectly)
	// need to resolve exports in this module. The only things that can be exported are
	// functions and map variables, which must already be present if they're exported, so
	// this is okay.

	// This must be done first for 2 reasons:
	// 1. If not, corrupt modules cause memory leaks
	// 2. Corrupt modules won't be reported when a level is being loaded if this function quits before
	//    adding it to the list.

	if (fr == NULL) len = Wads.LumpLength (lumpnum);



	// Any behaviors smaller than 32 bytes cannot possibly contain anything useful.
	// (16 bytes for a completely empty behavior + 12 bytes for one script header
	//  + 4 bytes for PCD_TERMINATE for an old-style object. A new-style object
	// has 24 bytes if it is completely empty. An empty SPTR chunk adds 8 bytes.)
	if (len < 32)
	{
		return false;
	}

	object = new BYTE[len];
	if (fr == NULL)
	{
		Wads.ReadLump (lumpnum, object);
	}
	else
	{
		fr->Read (object, len);
	}

	if (object[0] != 'A' || object[1] != 'C' || object[2] != 'S')
	{
		delete[] object;
		return false;
	}

	switch (object[3])
	{
	case 0:
		Format = ACS_Old;
		break;
	case 'E':
		Format = ACS_Enhanced;
		break;
	case 'e':
		Format = ACS_LittleEnhanced;
		break;
	default:
		delete[] object;
		return false;
	}
    LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;

	if (fr == NULL)
	{
		Wads.GetLumpName (ModuleName, lumpnum);
		ModuleName[8] = 0;
	}
	else
	{
		strcpy(ModuleName, "BEHAVIOR");
	}

	Data = object;
	DataSize = len;

	if (Format == ACS_Old)
	{
		DWORD dirofs = LittleLong(((DWORD *)object)[1]);
		DWORD pretag = ((DWORD *)(object + dirofs))[-1];

		Chunks = object + len;
		// Check for redesigned ACSE/ACSe
		if (dirofs >= 6*4 &&
			(pretag == MAKE_ID('A','C','S','e') ||
			 pretag == MAKE_ID('A','C','S','E')))
		{
			Format = (pretag == MAKE_ID('A','C','S','e')) ? ACS_LittleEnhanced : ACS_Enhanced;
			Chunks = object + LittleLong(((DWORD *)(object + dirofs))[-2]);
			// Forget about the compatibility cruft at the end of the lump
			DataSize = LittleLong(((DWORD *)object)[1]) - 8;
		}
	}
	else
	{
		Chunks = object + LittleLong(((DWORD *)object)[1]);
	}

	LoadScriptsDirectory ();

	if (Format == ACS_Old)
	{
		StringTable = LittleLong(((DWORD *)Data)[1]);
		StringTable += LittleLong(((DWORD *)(Data + StringTable))[0]) * 12 + 4;
		UnescapeStringTable(Data + StringTable, Data, false);
	}
	else
	{
		UnencryptStrings ();
		BYTE *strings = FindChunk (MAKE_ID('S','T','R','L'));
		if (strings != NULL)
		{
			StringTable = DWORD(strings - Data + 8);
			UnescapeStringTable(strings + 8, NULL, true);
		}
		else
		{
			StringTable = 0;
		}
	}

	if (Format == ACS_Old)
	{
		// Do initialization for old-style behavior lumps
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}
		//LibraryID = StaticModules.Push (this) << LIBRARYID_SHIFT;
	}
	else
	{
		DWORD *chunk;

		// Load functions
		BYTE *funcs;
		Functions = NULL;
		funcs = FindChunk (MAKE_ID('F','U','N','C'));
		if (funcs != NULL)
		{
			NumFunctions = LittleLong(((DWORD *)funcs)[1]) / 8;
			funcs += 8;
			FunctionProfileData = new ACSProfileInfo[NumFunctions];
			Functions = new ScriptFunction[NumFunctions];
			for (i = 0; i < NumFunctions; ++i)
			{
				ScriptFunctionInFile *funcf = &((ScriptFunctionInFile *)funcs)[i];
				ScriptFunction *funcm = &Functions[i];
				funcm->ArgCount = funcf->ArgCount;
				funcm->HasReturnValue = funcf->HasReturnValue;
				funcm->ImportNum = funcf->ImportNum;
				funcm->LocalCount = funcf->LocalCount;
				funcm->Address = LittleLong(funcf->Address);
			}
		}

		// Load local arrays for functions
		if (NumFunctions > 0)
		{
			for (chunk = (DWORD *)FindChunk(MAKE_ID('F','A','R','Y')); chunk != NULL; chunk = (DWORD *)NextChunk((BYTE *)chunk))
			{
				int size = LittleLong(chunk[1]);
				if (size >= 6)
				{
					unsigned int func_num = LittleShort(((WORD *)chunk)[4]);
					if (func_num < (unsigned int)NumFunctions)
					{
						ScriptFunction *func = &Functions[func_num];
						// Unlike scripts, functions do not include their arg count in their local count.
						func->LocalCount = ParseLocalArrayChunk(chunk, &func->LocalArrays, func->LocalCount + func->ArgCount) - func->ArgCount;
					}
				}
			}
		}

		// Load JUMP points
		chunk = (DWORD *)FindChunk (MAKE_ID('J','U','M','P'));
		if (chunk != NULL)
		{
			for (i = 0;i < (int)LittleLong(chunk[1]);i += 4)
				JumpPoints.Push(LittleLong(chunk[2 + i/4]));
		}

		// Initialize this object's map variables
		memset (MapVarStore, 0, sizeof(MapVarStore));
		chunk = (DWORD *)FindChunk (MAKE_ID('M','I','N','I'));
		while (chunk != NULL)
		{
			int numvars = LittleLong(chunk[1])/4 - 1;
			int firstvar = LittleLong(chunk[2]);
			for (i = 0; i < numvars; ++i)
			{
				MapVarStore[i+firstvar] = LittleLong(chunk[3+i]);
			}
			chunk = (DWORD *)NextChunk ((BYTE *)chunk);
		}

		// Initialize this object's map variable pointers to defaults. They can be changed
		// later once the imported modules are loaded.
		for (i = 0; i < NUM_MAPVARS; ++i)
		{
			MapVars[i] = &MapVarStore[i];
		}

		// Create arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','R','A','Y'));
		if (chunk != NULL)
		{
			NumArrays = LittleLong(chunk[1])/8;
			ArrayStore = new ArrayInfo[NumArrays];
			memset (ArrayStore, 0, sizeof(*Arrays)*NumArrays);
			for (i = 0; i < NumArrays; ++i)
			{
				MapVarStore[LittleLong(chunk[2+i*2])] = i;
				ArrayStore[i].ArraySize = LittleLong(chunk[3+i*2]);
				ArrayStore[i].Elements = new SDWORD[ArrayStore[i].ArraySize];
				memset(ArrayStore[i].Elements, 0, ArrayStore[i].ArraySize*sizeof(DWORD));
			}
		}

		// Initialize arrays for this module
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','N','I'));
		while (chunk != NULL)
		{
			int arraynum = MapVarStore[LittleLong(chunk[2])];
			if ((unsigned)arraynum < (unsigned)NumArrays)
			{
				// Use unsigned iterator here to avoid issue with GCC 4.9/5.x
				// optimizer. Might be some undefined behavior in this code,
				// but I don't know what it is.
				unsigned int initsize = MIN<unsigned int> (ArrayStore[arraynum].ArraySize, (LittleLong(chunk[1])-4)/4);
				SDWORD *elems = ArrayStore[arraynum].Elements;
				for (unsigned int j = 0; j < initsize; ++j)
				{
					elems[j] = LittleLong(chunk[3+j]);
				}
			}
			chunk = (DWORD *)NextChunk((BYTE *)chunk);
		}

		// Start setting up array pointers
		NumTotalArrays = NumArrays;
		chunk = (DWORD *)FindChunk (MAKE_ID('A','I','M','P'));
		if (chunk != NULL)
		{
			NumTotalArrays += LittleLong(chunk[2]);
		}
		if (NumTotalArrays != 0)
		{
			Arrays = new ArrayInfo *[NumTotalArrays];
			for (i = 0; i < NumArrays; ++i)
			{
				Arrays[i] = &ArrayStore[i];
			}
		}

		// Tag the library ID to any map variables that are initialized with strings
		if (LibraryID != 0)
		{
			chunk = (DWORD *)FindChunk (MAKE_ID('M','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					const char *str = LookupString(MapVarStore[LittleLong(chunk[i+2])]);
					if (str != NULL)
					{
						MapVarStore[LittleLong(chunk[i+2])] = GlobalACSStrings.AddString(str);
					}
				}
			}

			chunk = (DWORD *)FindChunk (MAKE_ID('A','S','T','R'));
			if (chunk != NULL)
			{
				for (DWORD i = 0; i < LittleLong(chunk[1])/4; ++i)
				{
					int arraynum = MapVarStore[LittleLong(chunk[i+2])];
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						for (int j = ArrayStore[arraynum].ArraySize; j > 0; --j, ++elems)
						{
//							*elems |= LibraryID;
							const char *str = LookupString(*elems);
							if (str != NULL)
							{
								*elems = GlobalACSStrings.AddString(str);
							}
						}
					}
				}
			}

			// [BL] Newer version of ASTR for structure aware compilers although we only have one array per chunk
			chunk = (DWORD *)FindChunk (MAKE_ID('A','T','A','G'));
			while (chunk != NULL)
			{
				const BYTE* chunkData = (const BYTE*)(chunk + 2);
				// First byte is version, it should be 0
				if(*chunkData++ == 0)
				{
					int arraynum = MapVarStore[uallong(LittleLong(*(const int*)(chunkData)))];
					chunkData += 4;
					if ((unsigned)arraynum < (unsigned)NumArrays)
					{
						SDWORD *elems = ArrayStore[arraynum].Elements;
						// Ending zeros may be left out.
						for (int j = MIN(LittleLong(chunk[1])-5, ArrayStore[arraynum].ArraySize); j > 0; --j, ++elems, ++chunkData)
						{
							// For ATAG, a value of 0 = Integer, 1 = String, 2 = FunctionPtr
							// Our implementation uses the same tags for both String and FunctionPtr
							if (*chunkData == 2)
							{
								*elems |= LibraryID;
							}
							else if (*chunkData == 1)
							{
								const char *str = LookupString(*elems);
								if (str != NULL)
								{
									*elems = GlobalACSStrings.AddString(str);
								}
							}
						}
					}
				}

				chunk = (DWORD *)NextChunk ((BYTE *)chunk);
			}
		}

		// Load required libraries.
		if (NULL != (chunk = (DWORD *)FindChunk (MAKE_ID('L','O','A','D'))))
		{
			const char *const parse = (char *)&chunk[2];
			DWORD i;

			for (i = 0; i < LittleLong(chunk[1]); )
			{
				if (parse[i])
				{
					FBehavior *module = NULL;
					int lump = Wads.CheckNumForName (&parse[i], ns_acslibrary);
					if (lump < 0)
					{
						Printf (TEXTCOLOR_RED "Could not find ACS library %s.\n", &parse[i]);
					}
					else
					{
						module = StaticLoadModule (lump);
					}
					if (module != NULL) Imports.Push (module);
					do {;} while (parse[++i]);
				}
				++i;
			}

			// Go through each imported module in order and resolve all imported functions
			// and map variables.
			for (i = 0; i < Imports.Size(); ++i)
			{
				FBehavior *lib = Imports[i];
				int j;

				if (lib == NULL)
					continue;

				// Resolve functions
				chunk = (DWORD *)FindChunk(MAKE_ID('F','N','A','M'));
				for (j = 0; j < NumFunctions; ++j)
				{
					ScriptFunction *func = &((ScriptFunction *)Functions)[j];
					if (func->Address == 0 && func->ImportNum == 0)
					{
						int libfunc = lib->FindFunctionName ((char *)(chunk + 2) + LittleLong(chunk[3+j]));
						if (libfunc >= 0)
						{
							ScriptFunction *realfunc = &((ScriptFunction *)lib->Functions)[libfunc];
							// Make sure that the library really defines this function. It might simply
							// be importing it itself.
							if (realfunc->Address != 0 && realfunc->ImportNum == 0)
							{
								func->Address = libfunc;
								func->ImportNum = i+1;
								if (realfunc->ArgCount != func->ArgCount)
								{
									Printf (TEXTCOLOR_ORANGE "Function %s in %s has %d arguments. %s expects it to have %d.\n",
										(char *)(chunk + 2) + LittleLong(chunk[3+j]), lib->ModuleName, realfunc->ArgCount,
										ModuleName, func->ArgCount);
									Format = ACS_Unknown;
								}
								// The next two properties do not affect code compatibility, so it is
								// okay for them to be different in the imported module than they are
								// in this one, as long as we make sure to use the real values.
								func->LocalCount = LittleLong(realfunc->LocalCount);
								func->HasReturnValue = realfunc->HasReturnValue;
							}
						}
					}
				}

				// Resolve map variables
				chunk = (DWORD *)FindChunk(MAKE_ID('M','I','M','P'));
				if (chunk != NULL)
				{
					char *parse = (char *)&chunk[2];
					for (DWORD j = 0; j < LittleLong(chunk[1]); )
					{
						DWORD varNum = LittleLong(*(DWORD *)&parse[j]);
						j += 4;
						int impNum = lib->FindMapVarName (&parse[j]);
						if (impNum >= 0)
						{
							MapVars[varNum] = &lib->MapVarStore[impNum];
						}
						do {;} while (parse[++j]);
						++j;
					}
				}

				// Resolve arrays
				if (NumTotalArrays > NumArrays)
				{
					chunk = (DWORD *)FindChunk(MAKE_ID('A','I','M','P'));
					char *parse = (char *)&chunk[3];
					for (DWORD j = 0; j < LittleLong(chunk[2]); ++j)
					{
						DWORD varNum = LittleLong(*(DWORD *)parse);
						parse += 4;
						DWORD expectedSize = LittleLong(*(DWORD *)parse);
						parse += 4;
						int impNum = lib->FindMapArray (parse);
						if (impNum >= 0)
						{
							Arrays[NumArrays + j] = &lib->ArrayStore[impNum];
							MapVarStore[varNum] = NumArrays + j;
							if (lib->ArrayStore[impNum].ArraySize != expectedSize)
							{
								Format = ACS_Unknown;
								Printf (TEXTCOLOR_ORANGE "The array %s in %s has %u elements, but %s expects it to only have %u.\n",
									parse, lib->ModuleName, lib->ArrayStore[impNum].ArraySize,
									ModuleName, expectedSize);
							}
						}
						do {;} while (*++parse);
						++parse;
					}
				}
			}
		}
	}

	DPrintf (DMSG_NOTIFY, "Loaded %d scripts, %d functions\n", NumScripts, NumFunctions);
	return true;
}